

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O1

ReturnType __thiscall
ezy::features::result_interface<ezy::features::result_adapter>::
impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
::map_or<____C_A_T_C_H____T_E_S_T____28()::__0&,int>
          (impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
           *this,anon_class_1_0_00000001 *fn,int *alternative)

{
  ReturnType RVar1;
  anon_class_1_0_00000001 *in_RCX;
  anon_class_1_0_00000001 local_39;
  variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  _impl::
  map<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>,____C_A_T_C_H____T_E_S_T____28()::__0&>
            ((strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
              *)&local_38,(_impl *)this,
             (strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
              *)alternative,in_RCX);
  RVar1 = _impl::
          success_or<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>,int>
                    ((strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
                      *)&local_38,(int *)fn);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr
    [local_38.
     super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Copy_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Variant_storage_alias<int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
            (&local_39,&local_38);
  return RVar1;
}

Assistant:

decltype(auto) map_or(Fn&& fn, Alternative&& alternative) &&
      {
        return _impl::map_or(static_cast<T&&>(*this), std::forward<Fn>(fn), std::forward<Alternative>(alternative));
      }